

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConveyor.cpp
# Opt level: O1

void __thiscall chrono::ChConveyor::ArchiveOUT(ChConveyor *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChLinkLockLock_*> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChConveyor>(marchive);
  ChPhysicsItem::ArchiveOUT(&this->super_ChPhysicsItem,marchive);
  local_38._value = (ChLinkLockLock **)&this->conveyor_speed;
  local_38._name = "conveyor_speed";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_38._value = (ChLinkLockLock **)&this->conveyor_truss;
  local_38._name = "conveyor_truss";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChBody>(marchive,(ChNameValue<chrono::ChBody_*> *)&local_38);
  local_38._value = (ChLinkLockLock **)&this->conveyor_plate;
  local_38._name = "conveyor_plate";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChBody>(marchive,(ChNameValue<chrono::ChBody_*> *)&local_38);
  local_38._value = &this->internal_link;
  local_38._name = "internal_link";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChLinkLockLock>(marchive,&local_38);
  return;
}

Assistant:

void ChConveyor::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChConveyor>();

    // serialize parent class
    ChPhysicsItem::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(conveyor_speed);
    marchive << CHNVP(conveyor_truss);
    marchive << CHNVP(conveyor_plate);
    marchive << CHNVP(internal_link);
}